

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O0

_Bool rtosc_match_partial(char *a,char *b)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  char *in_RSI;
  char *in_RDI;
  int type;
  char patternbuf [256];
  char *in_stack_fffffffffffffef8;
  char *local_18;
  char *local_10;
  bool local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar2 = rtosc_subpath_pat_type(in_stack_fffffffffffffef8);
  if (iVar2 == 1) {
    local_1 = true;
  }
  else if ((iVar2 == 2) || (iVar2 == 3)) {
    do {
      _Var1 = rtosc_match_char(&local_10,&local_18);
    } while (_Var1);
    if ((*local_10 == '\0') && (*local_18 == '\0')) {
      local_1 = true;
    }
    else if ((*local_10 == '\0') || ((*local_18 != '*' || (local_18[1] != '\0')))) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else if ((iVar2 == 5) || (iVar2 == 6)) {
    local_1 = false;
  }
  else if (iVar2 == 7) {
    do {
      _Var1 = rtosc_match_char(&local_10,&local_18);
    } while (_Var1);
    if (((*local_10 == '\0') || (*local_18 != '#')) || (local_18[1] == '\0')) {
      local_1 = false;
    }
    else {
      iVar2 = atoi(local_10);
      iVar3 = atoi(local_18 + 1);
      local_1 = iVar2 < iVar3;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool rtosc_match_partial(const char *a, const char *b)
{
    //assume a is of the form X
    //assume b is a pattern of the form: (1..6)
    //This is done to avoid backtracking of any kind
    //This is an OSC serialization library, not a regex
    //implementation

    char patternbuf[256];
    (void) patternbuf;
    int type = rtosc_subpath_pat_type(b);

    if(type == RTOSC_MATCH_ALL)
        return true;
    else if(type == RTOSC_MATCH_CHAR || type == RTOSC_MATCH_PARTIAL_CHAR) {
        while(rtosc_match_char(&a,&b));
        if(!*a && !*b)
            return true;
        else if(*a && *b=='*' && b[1] == '\0')
            return true;
        else
            return false;
    /*
    } else if(type == 4) {
        //extract substring
        const char *sub=NULL;
        return strstr(a,sub);
        */
    } else if(type == RTOSC_MATCH_OPTIONS || type == 6) {
        return false;
    } else if(type == RTOSC_MATCH_ENUMERATED) {
        while(rtosc_match_char(&a,&b));
        if(*a && *b=='#' && b[1] != '\0')
            return atoi(a) < atoi(b+1);
        return false;
    } else
        return 0;
    assert(false);
}